

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_immediate_close(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uv_fs_event_t *puVar6;
  uv_fs_event_t *puVar7;
  size_t sVar8;
  int in_ECX;
  int extraout_EDX;
  long lVar9;
  code *__s1;
  undefined1 *puVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  uv_timer_t timer;
  size_t sStack_648;
  char acStack_640 [1032];
  uv_fs_event_t *puStack_238;
  uv_fs_event_t uStack_1f8;
  uv_fs_event_t uStack_170;
  undefined8 uStack_e8;
  undefined1 local_a0 [152];
  
  puVar3 = (undefined1 *)uv_default_loop();
  puVar10 = puVar3;
  iVar2 = uv_timer_init(puVar3,local_a0);
  if (iVar2 == 0) {
    puVar10 = local_a0;
    in_ECX = 0;
    iVar2 = uv_timer_start(puVar10,timer_cb,1);
    if (iVar2 != 0) goto LAB_001515be;
    uv_run(puVar3,0);
    if (close_cb_called != 2) goto LAB_001515c3;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    puVar3 = (undefined1 *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_immediate_close_cold_1();
LAB_001515be:
    puVar3 = puVar10;
    run_test_fs_event_immediate_close_cold_2();
LAB_001515c3:
    run_test_fs_event_immediate_close_cold_3();
  }
  run_test_fs_event_immediate_close_cold_4();
  iVar2 = uv_fs_event_init(*(undefined8 *)(puVar3 + 8),&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    if (iVar2 == 0) {
      uv_close(&fs_event,close_cb);
      iVar2 = uv_close(puVar3,close_cb);
      return iVar2;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  uVar4 = uv_default_loop();
  create_dir("watch_dir");
  create_file("watch_dir/file");
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    if (iVar2 != 0) goto LAB_0015171d;
    touch_file("watch_dir/file");
    uv_close(&fs_event,close_cb);
    uv_run(uVar4,0);
    if (close_cb_called != 1) goto LAB_00151722;
    remove("watch_dir/file");
    remove("watch_dir/");
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0015171d:
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00151722:
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  run_test_fs_event_close_with_pending_event_cold_4();
  uVar4 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    if (iVar2 != 0) goto LAB_00151848;
    iVar2 = uv_timer_init(uVar4,&::timer);
    if (iVar2 != 0) goto LAB_0015184d;
    in_ECX = 0;
    iVar2 = uv_timer_start(&::timer,fs_event_create_files,100);
    if (iVar2 != 0) goto LAB_00151852;
    uv_run(uVar4,0);
    uv_close(&::timer,close_cb);
    uv_run(uVar4,1);
    if (close_cb_called != 2) goto LAB_00151857;
    if (fs_event_cb_called != 3) goto LAB_0015185c;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/");
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_close_in_callback_cold_1();
LAB_00151848:
    run_test_fs_event_close_in_callback_cold_2();
LAB_0015184d:
    run_test_fs_event_close_in_callback_cold_3();
LAB_00151852:
    run_test_fs_event_close_in_callback_cold_4();
LAB_00151857:
    run_test_fs_event_close_in_callback_cold_5();
LAB_0015185c:
    run_test_fs_event_close_in_callback_cold_6();
  }
  run_test_fs_event_close_in_callback_cold_7();
  if (in_ECX == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        iVar2 = uv_close();
        return iVar2;
      }
      return extraout_EAX;
    }
  }
  else {
    fs_event_cb_close_cold_1();
  }
  fs_event_cb_close_cold_2();
  uStack_e8 = uVar4;
  puVar6 = (uv_fs_event_t *)uv_default_loop();
  create_dir("watch_dir");
  __s1 = (code *)&uStack_170;
  puVar7 = puVar6;
  iVar2 = uv_fs_event_init();
  if (iVar2 == 0) {
    __s1 = fs_event_cb_dir;
    puVar7 = &uStack_170;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar7,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001519b7;
    __s1 = (code *)&uStack_1f8;
    puVar7 = puVar6;
    iVar2 = uv_fs_event_init();
    if (iVar2 != 0) goto LAB_001519bc;
    __s1 = fs_event_cb_dir;
    puVar7 = &uStack_1f8;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar7,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001519c1;
    uv_close(&uStack_1f8,close_cb);
    uv_close(&uStack_170);
    __s1 = (code *)0x0;
    puVar7 = puVar6;
    uv_run();
    if (close_cb_called != 2) goto LAB_001519c6;
    remove("watch_dir/");
    puVar6 = (uv_fs_event_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    __s1 = (code *)0x0;
    uv_run(puVar6);
    puVar7 = (uv_fs_event_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_001519b7:
    run_test_fs_event_start_and_close_cold_2();
LAB_001519bc:
    run_test_fs_event_start_and_close_cold_3();
LAB_001519c1:
    run_test_fs_event_start_and_close_cold_4();
LAB_001519c6:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (in_ECX != 0) goto LAB_00151a2b;
    if (extraout_EDX != 2) goto LAB_00151a30;
    iVar2 = strcmp((char *)__s1,"file1");
    if (iVar2 != 0) goto LAB_00151a35;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      iVar2 = uv_close(&fs_event,close_cb);
      return iVar2;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00151a2b:
    fs_event_cb_dir_cold_2();
LAB_00151a30:
    fs_event_cb_dir_cold_3();
LAB_00151a35:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_238 = puVar6;
  uVar4 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar9 = 0;
  do {
    iVar2 = uv_fs_event_init(uVar4,&fs_event);
    if (iVar2 != 0) {
LAB_00151c34:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00151c39;
    }
    sStack_648 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_640,&sStack_648);
    if (iVar2 != -0x16) {
LAB_00151c2f:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00151c34;
    }
    __s = *(char **)((long)&DAT_001c8ca0 + lVar9);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar2 != 0) {
LAB_00151c2a:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00151c2f;
    }
    sStack_648 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_640,&sStack_648);
    sVar1 = sStack_648;
    if (iVar2 != -0x69) {
LAB_00151c25:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00151c2a;
    }
    if (0x3ff < sStack_648) {
LAB_00151c20:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00151c25;
    }
    sVar8 = strlen(__s);
    if (sVar1 != sVar8 + 1) {
LAB_00151c1b:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00151c20;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_640,&sStack_648);
    sVar1 = sStack_648;
    if (iVar2 != 0) {
LAB_00151c16:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00151c1b;
    }
    sVar8 = strlen(__s);
    if (sVar1 != sVar8) {
LAB_00151c11:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00151c16;
    }
    iVar2 = strcmp(acStack_640,__s);
    if (iVar2 != 0) {
LAB_00151c0c:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00151c11;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_00151c07:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00151c0c;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar4,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00151c07;
    }
    close_cb_called = 0;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x28);
  remove("watch_dir/");
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return 0;
  }
LAB_00151c39:
  run_test_fs_event_getpath_cold_12();
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar7 = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init(puVar7,&fs_event);
  if (iVar2 == 0) {
    puVar7 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0,in_R8,in_R9,uVar4);
    if (iVar2 == 0) goto LAB_00151d36;
    puVar7 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 != 0) goto LAB_00151d3b;
    puVar7 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0,in_R8,in_R9,uVar4);
    if (iVar2 == 0) goto LAB_00151d40;
    puVar7 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 == 0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar7 = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close(puVar7);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00151d4a;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151d36:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151d3b:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151d40:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151d4a:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar7,0);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_event_immediate_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 1, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}